

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t rar5_read_data_skip(archive_read *a)

{
  wchar_t wVar1;
  rar5 *prVar2;
  wchar_t ret;
  rar5 *rar;
  archive_read *a_local;
  
  prVar2 = get_context(a);
  if (((ulong)prVar2->main & 1) == 0) {
    wVar1 = consume(a,(prVar2->file).bytes_remaining);
    if (wVar1 == L'\0') {
      (prVar2->file).bytes_remaining = 0;
LAB_00195252:
      a_local._4_4_ = L'\0';
    }
    else {
      a_local._4_4_ = L'\xffffffe2';
    }
  }
  else {
    do {
      if ((prVar2->file).bytes_remaining < 1) goto LAB_00195252;
      prVar2->skip_mode = prVar2->skip_mode + L'\x01';
      a_local._4_4_ = rar5_read_data(a,(void **)0x0,(size_t *)0x0,(int64_t *)0x0);
      prVar2->skip_mode = prVar2->skip_mode + L'\xffffffff';
    } while ((L'\xffffffff' < a_local._4_4_) && (a_local._4_4_ != L'\x01'));
  }
  return a_local._4_4_;
}

Assistant:

static int rar5_read_data_skip(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	if(rar->main.solid) {
		/* In solid archives, instead of skipping the data, we need to
		 * extract it, and dispose the result. The side effect of this
		 * operation will be setting up the initial window buffer state
		 * needed to be able to extract the selected file. */

		int ret;

		/* Make sure to process all blocks in the compressed stream. */
		while(rar->file.bytes_remaining > 0) {
			/* Setting the "skip mode" will allow us to skip
			 * checksum checks during data skipping. Checking the
			 * checksum of skipped data isn't really necessary and
			 * it's only slowing things down.
			 *
			 * This is incremented instead of setting to 1 because
			 * this data skipping function can be called
			 * recursively. */
			rar->skip_mode++;

			/* We're disposing 1 block of data, so we use triple
			 * NULLs in arguments. */
			ret = rar5_read_data(a, NULL, NULL, NULL);

			/* Turn off "skip mode". */
			rar->skip_mode--;

			if(ret < 0 || ret == ARCHIVE_EOF) {
				/* Propagate any potential error conditions
				 * to the caller. */
				return ret;
			}
		}
	} else {
		/* In standard archives, we can just jump over the compressed
		 * stream. Each file in non-solid archives starts from an empty
		 * window buffer. */

		if(ARCHIVE_OK != consume(a, rar->file.bytes_remaining)) {
			return ARCHIVE_FATAL;
		}

		rar->file.bytes_remaining = 0;
	}

	return ARCHIVE_OK;
}